

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

ON_GeometryValue * __thiscall
ON_GeometryValue::operator=(ON_GeometryValue *this,ON_GeometryValue *src)

{
  ON_Geometry **ppOVar1;
  ON_Geometry *local_38;
  ON_Geometry *ptr;
  ON_Geometry *src_ptr;
  ON_Geometry *p;
  int count;
  int i;
  ON_GeometryValue *src_local;
  ON_GeometryValue *this_local;
  
  if (this != src) {
    _count = src;
    src_local = this;
    p._0_4_ = ON_SimpleArray<ON_Geometry_*>::Count(&this->m_value);
    for (p._4_4_ = 0; p._4_4_ < (int)p; p._4_4_ = p._4_4_ + 1) {
      ppOVar1 = ON_SimpleArray<ON_Geometry_*>::operator[](&this->m_value,p._4_4_);
      src_ptr = *ppOVar1;
      ppOVar1 = ON_SimpleArray<ON_Geometry_*>::operator[](&this->m_value,p._4_4_);
      *ppOVar1 = (ON_Geometry *)0x0;
      if ((src_ptr != (ON_Geometry *)0x0) && (src_ptr != (ON_Geometry *)0x0)) {
        (*(src_ptr->super_ON_Object)._vptr_ON_Object[4])();
      }
    }
    ON_SimpleArray<ON_Geometry_*>::Destroy(&this->m_value);
    (this->super_ON_Value).m_value_id = (_count->super_ON_Value).m_value_id;
    p._0_4_ = ON_SimpleArray<ON_Geometry_*>::Count(&_count->m_value);
    ON_SimpleArray<ON_Geometry_*>::Reserve(&this->m_value,(long)(int)p);
    for (p._4_4_ = 0; p._4_4_ < (int)p; p._4_4_ = p._4_4_ + 1) {
      ppOVar1 = ON_SimpleArray<ON_Geometry_*>::operator[](&_count->m_value,p._4_4_);
      ptr = *ppOVar1;
      if ((ptr != (ON_Geometry *)0x0) &&
         (local_38 = ON_Geometry::Duplicate(ptr), local_38 != (ON_Geometry *)0x0)) {
        ON_SimpleArray<ON_Geometry_*>::Append(&this->m_value,&local_38);
      }
    }
  }
  return this;
}

Assistant:

ON_GeometryValue& ON_GeometryValue::operator=(const ON_GeometryValue& src)
{
  if ( this != &src )
  {
    int i, count = m_value.Count();
    for ( i = 0; i < count; i++ )
    {
      ON_Geometry* p = m_value[i];
      m_value[i] = 0;
      if (p)
      {
        delete p;
      }
    }
    m_value.Destroy();

    m_value_id = src.m_value_id;

    count = src.m_value.Count();
    m_value.Reserve(count);
    for ( i = 0; i < count; i++ )
    {
      const ON_Geometry* src_ptr = src.m_value[i];
      if ( !src_ptr )
        continue;
      ON_Geometry* ptr = src_ptr->Duplicate();
      if ( ptr )
        m_value.Append(ptr);
    }
  }
  return *this;
}